

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::Chapters::Atom::ExpandDisplaysArray(Atom *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  Display *pDVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  long lVar11;
  int iVar12;
  
  iVar3 = this->m_displays_size;
  uVar4 = this->m_displays_count;
  if ((int)uVar4 < iVar3) {
    return true;
  }
  iVar12 = 1;
  if (iVar3 != 0) {
    iVar12 = iVar3 * 2;
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)iVar12;
  uVar8 = SUB168(auVar6 * ZEXT816(0x18),0);
  uVar9 = uVar8 + 8;
  if (0xfffffffffffffff7 < uVar8) {
    uVar9 = 0xffffffffffffffff;
  }
  uVar8 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0x18),8) == 0) {
    uVar8 = uVar9;
  }
  puVar10 = (ulong *)operator_new__(uVar8,(nothrow_t *)&std::nothrow);
  if (puVar10 == (ulong *)0x0) {
    return false;
  }
  *puVar10 = (long)iVar12;
  pDVar5 = this->m_displays;
  if ((int)uVar4 < 1) {
    if (pDVar5 == (Display *)0x0) goto LAB_00110abc;
  }
  else {
    lVar11 = 0;
    do {
      puVar1 = (undefined8 *)((long)&pDVar5->m_string + lVar11);
      uVar7 = puVar1[1];
      puVar2 = (undefined8 *)((long)puVar10 + lVar11 + 8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      *(undefined8 *)((long)puVar10 + lVar11 + 0x18) =
           *(undefined8 *)((long)&pDVar5->m_country + lVar11);
      lVar11 = lVar11 + 0x18;
    } while ((ulong)uVar4 * 0x18 != lVar11);
  }
  operator_delete__(&pDVar5[-1].m_country);
LAB_00110abc:
  this->m_displays = (Display *)(puVar10 + 1);
  this->m_displays_size = iVar12;
  return true;
}

Assistant:

bool Chapters::Atom::ExpandDisplaysArray() {
  if (m_displays_size > m_displays_count)
    return true;  // nothing else to do

  const int size = (m_displays_size == 0) ? 1 : 2 * m_displays_size;

  Display* const displays = new (std::nothrow) Display[size];

  if (displays == NULL)
    return false;

  for (int idx = 0; idx < m_displays_count; ++idx) {
    m_displays[idx].ShallowCopy(displays[idx]);
  }

  delete[] m_displays;
  m_displays = displays;

  m_displays_size = size;
  return true;
}